

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayoutPrivate::~QBoxLayoutPrivate(QBoxLayoutPrivate *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QBoxLayoutPrivate_00d06588;
  QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x2f2631);
  QList<QBoxLayoutItem_*>::~QList((QList<QBoxLayoutItem_*> *)0x2f2642);
  QLayoutPrivate::~QLayoutPrivate((QLayoutPrivate *)0x2f264c);
  return;
}

Assistant:

QBoxLayoutPrivate::~QBoxLayoutPrivate()
{
}